

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

bool __thiscall
wasm::BranchUtils::BranchSeeker::has(BranchSeeker *this,Expression *tree,Name target)

{
  Name target_00;
  bool bVar1;
  undefined1 local_150 [8];
  BranchSeeker seeker;
  Expression *tree_local;
  Name target_local;
  
  target_local.super_IString.str._M_len = target.super_IString.str._M_len;
  seeker.types._M_h._M_single_bucket = (__node_base_ptr)this;
  tree_local = tree;
  bVar1 = IString::is((IString *)&tree_local);
  if (bVar1) {
    target_00.super_IString.str._M_str = (char *)target_local.super_IString.str._M_len;
    target_00.super_IString.str._M_len = (size_t)tree_local;
    BranchSeeker((BranchSeeker *)local_150,target_00);
    Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    ::walk((Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
            *)local_150,(Expression **)&seeker.types._M_h._M_single_bucket);
    target_local.super_IString.str._M_str._7_1_ = (int)seeker.target.super_IString.str._M_str != 0;
    ~BranchSeeker((BranchSeeker *)local_150);
  }
  else {
    target_local.super_IString.str._M_str._7_1_ = 0;
  }
  return (bool)(target_local.super_IString.str._M_str._7_1_ & 1);
}

Assistant:

static bool has(Expression* tree, Name target) {
    if (!target.is()) {
      return false;
    }
    BranchSeeker seeker(target);
    seeker.walk(tree);
    return seeker.found > 0;
  }